

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImU32 col_00;
  ImU32 in_ECX;
  ImRect *in_RSI;
  ImDrawList *in_RDI;
  float rhs;
  float y2;
  float y1;
  float rounding;
  float width;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff78;
  ImDrawList *pIVar1;
  ImDrawList *in_stack_ffffffffffffff80;
  ImVec2 *points;
  ImDrawList *pIVar2;
  int iVar3;
  undefined8 in_stack_ffffffffffffffa0;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  ImGuiContext *local_20;
  ImU32 local_18;
  ImRect *local_10;
  ImDrawList *local_8;
  
  local_20 = GImGui;
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = ImRect::GetWidth(in_RSI);
  rhs = ImMin<float>((local_20->Style).TabRounding,local_24 * 0.5 + -1.0);
  local_28 = ImMax<float>(0.0,rhs);
  local_2c = (local_10->Min).y + 1.0;
  local_30 = (local_10->Max).y - 1.0;
  pIVar2 = local_8;
  ImVec2::ImVec2(&local_38,(local_10->Min).x,local_30);
  ImDrawList::PathLineTo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pIVar1 = local_8;
  ImVec2::ImVec2(&local_40,(local_10->Min).x + local_28,local_2c + local_28);
  iVar3 = (int)((ulong)pIVar1 >> 0x20);
  ImDrawList::PathArcToFast
            ((ImDrawList *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0,iVar3)
  ;
  pIVar1 = local_8;
  ImVec2::ImVec2(&local_48,(local_10->Max).x - local_28,local_2c + local_28);
  ImDrawList::PathArcToFast
            ((ImDrawList *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (float)((ulong)pIVar1 >> 0x20),(int)pIVar1,iVar3);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,(local_10->Max).x,local_30);
  ImDrawList::PathLineTo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ImDrawList::AddConvexPolyFilled(local_8,(local_8->_Path).Data,(local_8->_Path).Size,local_18);
  if (0.0 < (local_20->Style).TabBorderSize) {
    points = (local_8->_Path).Data;
    iVar3 = (local_8->_Path).Size;
    pIVar1 = local_8;
    col_00 = GetColorU32((ImGuiCol)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0));
    ImDrawList::AddPolyline(pIVar1,points,iVar3,col_00,false,(local_20->Style).TabBorderSize);
  }
  ImDrawList::PathClear(local_8);
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    (void)flags;
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    float y1 = bb.Min.y + 1.0f;
    float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->AddConvexPolyFilled(draw_list->_Path.Data, draw_list->_Path.Size, col);
    if (g.Style.TabBorderSize > 0.0f)
        draw_list->AddPolyline(draw_list->_Path.Data, draw_list->_Path.Size, GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    draw_list->PathClear();
}